

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O2

void testInvert(void)

{
  ostream *poVar1;
  undefined1 local_178 [16];
  float local_168 [12];
  undefined1 local_138 [16];
  float local_128 [12];
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float fStack_d8;
  float local_d4 [2];
  undefined1 local_cc [16];
  float local_bc;
  M44f local_b8;
  M44f local_70;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing 4x4 and 3x3 matrix inversion:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"M44f");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_b8.x[0][0] = 1.0;
  local_b8.x[0][1] = 0.0;
  local_b8.x[0][2] = 0.0;
  local_b8.x[0][3] = 0.0;
  local_b8.x[1][0] = 0.0;
  local_b8.x[1][1] = 1.0;
  local_b8.x[1][2] = 0.0;
  local_b8.x[1][3] = 0.0;
  local_b8.x[2][0] = 0.0;
  local_b8.x[2][1] = 0.0;
  local_b8.x[2][2] = 1.0;
  local_b8.x[2][3] = 0.0;
  local_b8.x[3][0] = 0.0;
  local_b8.x[3][1] = 0.0;
  local_b8.x[3][2] = 0.0;
  local_b8.x[3][3] = 1.0;
  local_f8._0_4_ = 0.0;
  local_f8._4_4_ = 1.0;
  local_f8._8_4_ = 0.0;
  local_f8._12_4_ = 0.0;
  local_e8 = -1.0;
  fStack_e4 = 0.0;
  fStack_e0 = 0.0;
  fStack_dc = 0.0;
  fStack_d8 = 0.0;
  local_d4[0] = 0.0;
  local_d4[1] = 1.0;
  local_70.x[0][0] = 1.0;
  local_70.x[0][1] = 0.0;
  local_70.x[0][2] = 0.0;
  local_70.x[0][3] = 0.0;
  local_70.x[1][0] = 0.0;
  local_70.x[1][1] = 2.0;
  local_70.x[1][2] = 0.0;
  local_70.x[1][3] = 0.0;
  local_70.x[2][0] = 0.0;
  local_70.x[2][1] = 0.0;
  local_70.x[2][2] = 0.0;
  local_70.x[2][3] = -1.0;
  local_70.x[3][0] = 0.0;
  local_70.x[3][1] = 0.0;
  local_70.x[3][2] = 1.0;
  local_70.x[3][3] = 0.0;
  local_cc._0_4_ = 0.0;
  local_cc._4_4_ = 0.0;
  local_cc._8_4_ = 0.0;
  local_cc._12_4_ = 0.0;
  local_bc = 1.0;
  local_138._0_4_ = 0.4683281;
  local_138._4_4_ = -0.8749647;
  local_138._8_4_ = 0.1229049;
  local_138._12_4_ = 0.0;
  local_128[0] = 0.01251189;
  local_128[1] = 0.1456563;
  local_128[2] = 0.9892561;
  local_128[3] = 0.0;
  local_128[4] = -0.883466;
  local_128[5] = -0.4617587;
  local_128[6] = 0.07916244;
  local_128[7] = 0.0;
  local_128[8] = -4.726541;
  local_128[9] = 3.044795;
  local_128[10] = -6.737138;
  local_128[0xb] = 1.0;
  local_178._0_4_ = 0.4683281;
  local_178._4_4_ = -0.8749647;
  local_178._8_4_ = 0.1229049;
  local_178._12_4_ = 1.0;
  local_168[0] = 0.01251189;
  local_168[1] = 0.1456563;
  local_168[2] = 0.9892561;
  local_168[3] = 2.0;
  local_168[4] = -0.883466;
  local_168[5] = -0.4617587;
  local_168[6] = 0.07916244;
  local_168[7] = 3.0;
  local_168[8] = -4.726541;
  local_168[9] = 3.044795;
  local_168[10] = -6.737138;
  local_168[0xb] = 4.0;
  anon_unknown.dwarf_8214a::invertM44f(&local_b8,0.0);
  anon_unknown.dwarf_8214a::invertM44f((M44f *)local_f8,0.0);
  anon_unknown.dwarf_8214a::invertM44f(&local_70,0.0);
  anon_unknown.dwarf_8214a::invertM44f((M44f *)local_138,1e-06);
  anon_unknown.dwarf_8214a::invertM44f((M44f *)local_178,1e-06);
  poVar1 = std::operator<<((ostream *)&std::cout,"M33f");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_b8.x[0][0] = 1.0;
  local_b8.x[0][1] = 0.0;
  local_b8.x[0][2] = 0.0;
  local_b8.x[0][3] = 0.0;
  local_b8.x[1][0] = 1.0;
  local_b8.x[1][1] = 0.0;
  local_b8.x[1][2] = 0.0;
  local_b8.x[1][3] = 0.0;
  local_b8.x[2][0] = 1.0;
  local_f8._0_4_ = 0.0;
  local_f8._4_4_ = 1.0;
  local_f8._8_4_ = 0.0;
  local_f8._12_4_ = -1.0;
  local_e8 = 0.0;
  fStack_e4 = 0.0;
  fStack_e0 = 0.0;
  fStack_dc = 0.0;
  fStack_d8 = 1.0;
  local_70.x[0][0] = 2.0;
  local_70.x[0][1] = 0.0;
  local_70.x[0][2] = 0.0;
  local_70.x[0][3] = 0.0;
  local_70.x[1][0] = 0.0;
  local_70.x[1][1] = -1.0;
  local_70.x[1][2] = 0.0;
  local_70.x[1][3] = 1.0;
  local_70.x[2][0] = 0.0;
  local_138._0_4_ = 0.4683281;
  local_138._4_4_ = -0.8749647;
  local_138._8_4_ = 0.0;
  local_138._12_4_ = 0.01251189;
  local_128[0] = 0.1456563;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  local_128[3] = 0.0;
  local_128[4] = 1.0;
  local_178._0_4_ = 0.4683281;
  local_178._4_4_ = -0.8749647;
  local_178._8_4_ = 0.1229049;
  local_178._12_4_ = 0.01251189;
  local_168[0] = 0.1456563;
  local_168[1] = 0.9892561;
  local_168[2] = -0.883466;
  local_168[3] = -0.4617587;
  local_168[4] = 0.07916244;
  anon_unknown.dwarf_8214a::invertM33f((M33f *)&local_b8,0.0);
  anon_unknown.dwarf_8214a::invertM33f((M33f *)local_f8,0.0);
  anon_unknown.dwarf_8214a::invertM33f((M33f *)&local_70,0.0);
  anon_unknown.dwarf_8214a::invertM33f((M33f *)local_138,1e-06);
  anon_unknown.dwarf_8214a::invertM33f((M33f *)local_178,1e-06);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testInvert ()
{
    cout << "Testing 4x4 and 3x3 matrix inversion:" << endl;

    {
        cout << "M44f" << endl;

        // clang-format off

	M44f m1 ( 1,  0,  0,  0,
		  0,  1,  0,  0,
		  0,  0,  1,  0,
		  0,  0,  0,  1);

	M44f m2 ( 0,  1,  0,  0,
		 -1,  0,  0,  0,
		  0,  0,  1,  0,
		  0,  0,  0,  1);

	M44f m3 ( 1,  0,  0,  0,
		  0,  2,  0,  0,
		  0,  0,  0, -1,
		  0,  0,  1,  0);

	M44f m4 ( 4.683281e-01f, -8.749647e-01f,  1.229049e-01f,  0.000000e+00f,
		  1.251189e-02f,  1.456563e-01f,  9.892561e-01f,  0.000000e+00f,
		 -8.834660e-01f, -4.617587e-01f,  7.916244e-02f,  0.000000e+00f,
		 -4.726541e+00f,  3.044795e+00f, -6.737138e+00f,  1.000000e+00f);

	M44f m5 ( 4.683281e-01f, -8.749647e-01f,  1.229049e-01f,  1.000000e+00f,
		  1.251189e-02f,  1.456563e-01f,  9.892561e-01f,  2.000000e+00f,
		 -8.834660e-01f, -4.617587e-01f,  7.916244e-02f,  3.000000e+00f,
		 -4.726541e+00f,  3.044795e+00f, -6.737138e+00f,  4.000000e+00f);

        // clang-format on

        invertM44f (m1, 0);
        invertM44f (m2, 0);
        invertM44f (m3, 0);
        invertM44f (m4, 1e-6f);
        invertM44f (m5, 1e-6f);
    }

    {
        cout << "M33f" << endl;

        // clang-format off

	M33f m1 ( 1,  0,  0,
		  0,  1,  0,
		  0,  0,  1);

	M33f m2 ( 0,  1,  0,
		 -1,  0,  0,
		  0,  0,  1);

	M33f m3 ( 2,  0,  0,
		  0,  0, -1,
		  0,  1,  0);

	M33f m4 ( 4.683281e-01f, -8.749647e-01f,  0.000000e+00f,
		  1.251189e-02f,  1.456563e-01f,  0.000000e+00f,
		  0.000000e+00f,  0.000000e+00f,  1.000000e+00f);

	M33f m5 ( 4.683281e-01f, -8.749647e-01f,  1.229049e-01f,
		  1.251189e-02f,  1.456563e-01f,  9.892561e-01f,
		 -8.834660e-01f, -4.617587e-01f,  7.916244e-02f);

        // clang-format on

        invertM33f (m1, 0);
        invertM33f (m2, 0);
        invertM33f (m3, 0);
        invertM33f (m4, 1e-6f);
        invertM33f (m5, 1e-6f);
    }

    cout << "ok\n" << endl;
}